

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoZ.cpp
# Opt level: O0

void __thiscall OpenMD::RhoZ::process(RhoZ *this)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  Snapshot *this_00;
  double *pdVar5;
  reference pvVar6;
  SelectionManager *pSVar7;
  reference ppSVar8;
  reference pvVar9;
  DumpReader *in_RDI;
  Vector3d *pos_00;
  uint k;
  RealType totalMass;
  uint i_1;
  int binNo;
  Vector3d pos_1;
  Vector3d pos;
  Mat3x3d hmat;
  RealType sliceVolume;
  uint i;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int ii;
  StuntDouble *sd;
  Snapshot *in_stack_ffffffffffffec18;
  DumpReader *in_stack_ffffffffffffec20;
  StuntDouble *in_stack_ffffffffffffec28;
  SelectionManager *in_stack_ffffffffffffec30;
  SelectionEvaluator *in_stack_ffffffffffffec58;
  SnapshotManager *in_stack_ffffffffffffeca8;
  uint local_133c;
  double local_1338;
  uint local_1330;
  Vector<double,_3U> local_1328 [3];
  RectMatrix<double,_3U,_3U> local_12e0;
  double local_1298;
  uint local_128c;
  int local_1288;
  int local_1274;
  string *in_stack_ffffffffffffee70;
  SimInfo *in_stack_ffffffffffffee78;
  DumpReader *in_stack_ffffffffffffee80;
  StuntDouble *local_10;
  
  SimInfo::getSimParams(*(SimInfo **)&in_RDI->filename_);
  bVar3 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1a2790);
  DumpReader::DumpReader
            (in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70);
  local_1274 = DumpReader::getNFrames(in_stack_ffffffffffffec20);
  *(int *)&in_RDI->field_0xd0 = local_1274 / *(int *)&in_RDI->inFile_;
  for (local_1288 = 0; local_1288 < local_1274; local_1288 = *(int *)&in_RDI->inFile_ + local_1288)
  {
    DumpReader::readFrame(in_RDI,(int)((ulong)in_stack_ffffffffffffeca8 >> 0x20));
    in_stack_ffffffffffffeca8 = SimInfo::getSnapshotManager(*(SimInfo **)&in_RDI->filename_);
    this_00 = SnapshotManager::getCurrentSnapshot(in_stack_ffffffffffffeca8);
    *(Snapshot **)&in_RDI->field_0xc8 = this_00;
    for (local_128c = 0; local_128c < *(uint *)&in_RDI->field_0x34; local_128c = local_128c + 1) {
      std::
      vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
      ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    *)(in_RDI->buffer + 0x4c2),(ulong)local_128c);
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::clear
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1a28c5);
    }
    pos_00 = (Vector3d *)Snapshot::getVolume((Snapshot *)in_stack_ffffffffffffec20);
    local_1298 = (double)pos_00 / (double)*(uint *)&in_RDI->field_0x34;
    Snapshot::getHmat(in_stack_ffffffffffffec18);
    RectMatrix<double,_3U,_3U>::operator()
              (&local_12e0,*(uint *)(in_RDI->buffer + 0x50a),*(uint *)(in_RDI->buffer + 0x50a));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec30,
               (value_type_conflict2 *)in_stack_ffffffffffffec28);
    bVar4 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&in_RDI->field_0xf8);
    if (bVar4) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffec58);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffec30,(SelectionSet *)in_stack_ffffffffffffec28);
      SelectionSet::~SelectionSet((SelectionSet *)0x1a2a04);
    }
    local_10 = SelectionManager::beginSelected
                         (in_stack_ffffffffffffec30,(int *)in_stack_ffffffffffffec28);
    while (local_10 != (StuntDouble *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffec28);
      if (bVar3) {
        Snapshot::wrapVector(this_00,pos_00);
      }
      StuntDouble::setPos((StuntDouble *)in_stack_ffffffffffffec30,
                          (Vector3d *)in_stack_ffffffffffffec28);
      local_10 = SelectionManager::nextSelected
                           (in_stack_ffffffffffffec30,(int *)in_stack_ffffffffffffec28);
    }
    local_10 = SelectionManager::beginSelected
                         (in_stack_ffffffffffffec30,(int *)in_stack_ffffffffffffec28);
    while (local_10 != (StuntDouble *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffec28);
      uVar2 = *(uint *)&in_RDI->field_0x34;
      in_stack_ffffffffffffec58 =
           (SelectionEvaluator *)
           Vector<double,_3U>::operator[](local_1328,*(uint *)(in_RDI->buffer + 0x50a));
      dVar1 = *(double *)&(in_stack_ffffffffffffec58->compiler).filename;
      pdVar5 = RectMatrix<double,_3U,_3U>::operator()
                         (&local_12e0,*(uint *)(in_RDI->buffer + 0x50a),
                          *(uint *)(in_RDI->buffer + 0x50a));
      std::
      vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
      ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    *)(in_RDI->buffer + 0x4c2),
                   (long)(int)((uint)(int)((double)uVar2 * (dVar1 / *pdVar5 + 0.5)) %
                              *(uint *)&in_RDI->field_0x34));
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                 in_stack_ffffffffffffec30,(value_type *)in_stack_ffffffffffffec28);
      local_10 = SelectionManager::nextSelected
                           (in_stack_ffffffffffffec30,(int *)in_stack_ffffffffffffec28);
    }
    for (local_1330 = 0; local_1330 < *(uint *)&in_RDI->field_0x34; local_1330 = local_1330 + 1) {
      local_1338 = 0.0;
      local_133c = 0;
      while( true ) {
        in_stack_ffffffffffffec30 = (SelectionManager *)(ulong)local_133c;
        pvVar6 = std::
                 vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               *)(in_RDI->buffer + 0x4c2),(ulong)local_1330);
        pSVar7 = (SelectionManager *)
                 std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                           (pvVar6);
        if (pSVar7 <= in_stack_ffffffffffffec30) break;
        pvVar6 = std::
                 vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               *)(in_RDI->buffer + 0x4c2),(ulong)local_1330);
        ppSVar8 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[](pvVar6,(ulong)local_133c);
        in_stack_ffffffffffffec28 = (StuntDouble *)StuntDouble::getMass(*ppSVar8);
        local_1338 = (double)in_stack_ffffffffffffec28 + local_1338;
        local_133c = local_133c + 1;
      }
      in_stack_ffffffffffffec20 = (DumpReader *)(local_1338 / local_1298);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4f2),
                          (ulong)local_1330);
      *pvVar9 = (double)in_stack_ffffffffffffec20 + *pvVar9;
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1a2db6);
  }
  (*(code *)(in_RDI->info_->randNumGen_).
            super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)();
  DumpReader::~DumpReader(in_stack_ffffffffffffec20);
  return;
}

Assistant:

void RhoZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      RealType sliceVolume = currentSnapshot_->getVolume() / nBins_;
      Mat3x3d hmat         = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      // RealType halfBoxZ_ = hmat(axis_,axis_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        // int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) /
        // hmat(axis_,axis_)); = int(nBins_ * ( 0.5 + pos[axis_] /
        // hmat(axis_,axis_) ) Shift molecules by half a box to have bins start
        // at 0 The modulo operator is used to wrap the case when we are beyond
        // the end of the bins back to the beginning. (from RNEMD.cpp)
        int binNo =
            int(nBins_ * (pos[axis_] / hmat(axis_, axis_) + 0.5)) % nBins_;
        sliceSDLists_[binNo].push_back(sd);
      }

      // loop over the slices to calculate the densities
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType totalMass = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          totalMass += sliceSDLists_[i][k]->getMass();
        }
        density_[i] += totalMass / sliceVolume;
      }
    }

    writeDensity();
  }